

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

PrecomputedTransactionData *
PrecomputePSBTData(PrecomputedTransactionData *__return_storage_ptr__,
                  PartiallySignedTransaction *psbt)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  size_t idx;
  ulong uVar5;
  long in_FS_OFFSET;
  vector<CTxOut,_std::allocator<CTxOut>_> local_68;
  vector<CTxOut,_std::allocator<CTxOut>_> utxos;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            (&utxos,((long)*(pointer *)
                            ((long)&(psbt->tx).
                                    super__Optional_base<CMutableTransaction,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                    .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                    _M_value.vin + 8) -
                    *(long *)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin) / 0x68,(allocator_type *)&local_68);
  bVar3 = 1;
  lVar4 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)*(pointer *)
                              ((long)&(psbt->tx).
                                      super__Optional_base<CMutableTransaction,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                      .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                      _M_value.vin + 8) -
                      *(long *)&(psbt->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin) / 0x68); uVar5 = uVar5 + 1) {
    bVar2 = PartiallySignedTransaction::GetInputUTXO
                      (psbt,(CTxOut *)
                            ((long)&(utxos.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->nValue + lVar4),
                       (int)uVar5);
    bVar3 = bVar3 & bVar2;
    lVar4 = lVar4 + 0x28;
  }
  memset(__return_storage_ptr__,0,0x102);
  (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_spent_outputs).
           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_spent_outputs).
           super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage + 1) = 0;
  if (bVar3 == 0) {
    local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    PrecomputedTransactionData::Init<CMutableTransaction>
              (__return_storage_ptr__,(CMutableTransaction *)psbt,&local_68,true);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_68);
  }
  else {
    PrecomputedTransactionData::Init<CMutableTransaction>
              (__return_storage_ptr__,(CMutableTransaction *)psbt,&utxos,true);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&utxos);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

PrecomputedTransactionData PrecomputePSBTData(const PartiallySignedTransaction& psbt)
{
    const CMutableTransaction& tx = *psbt.tx;
    bool have_all_spent_outputs = true;
    std::vector<CTxOut> utxos(tx.vin.size());
    for (size_t idx = 0; idx < tx.vin.size(); ++idx) {
        if (!psbt.GetInputUTXO(utxos[idx], idx)) have_all_spent_outputs = false;
    }
    PrecomputedTransactionData txdata;
    if (have_all_spent_outputs) {
        txdata.Init(tx, std::move(utxos), true);
    } else {
        txdata.Init(tx, {}, true);
    }
    return txdata;
}